

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trick.cpp
# Opt level: O3

int __thiscall Trick::getWinner(Trick *this,Contract *c)

{
  _List_node_base *p_Var1;
  bool bVar2;
  int iVar3;
  _List_node_base *p_Var4;
  Card *rhs;
  
  p_Var1 = (this->_cards).
           super__List_base<std::pair<Card_*,_int>,_std::allocator<std::pair<Card_*,_int>_>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  iVar3 = *(int *)&p_Var1[1]._M_prev;
  p_Var4 = p_Var1->_M_next;
  if (p_Var4 != (_List_node_base *)&this->_cards) {
    rhs = (Card *)p_Var1[1]._M_next;
    do {
      bVar2 = Card::isBigger((Card *)p_Var4[1]._M_next,rhs,c);
      if (bVar2) {
        rhs = (Card *)p_Var4[1]._M_next;
        iVar3 = *(int *)((long)(p_Var4 + 1) + 8);
      }
      p_Var4 = p_Var4->_M_next;
    } while (p_Var4 != (_List_node_base *)&this->_cards);
  }
  return iVar3;
}

Assistant:

int Trick::getWinner(Contract *c) {
    std::list<pair<Card *, int>>::iterator it = _cards.begin();
    pair<Card *, int> biggest = *it;
    for (++it; it != _cards.end(); ++it) {
        if (it->first->isBigger(biggest.first, c)) {
            biggest = *it;
        }
    }
    return biggest.second;
}